

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

QStringList * __thiscall
Parser::findEnumValues
          (QStringList *__return_storage_ptr__,Parser *this,QString *name,QStringList *includes)

{
  QString *pQVar1;
  QTextStream *this_00;
  QArrayData *data;
  char16_t *pcVar2;
  storage_type_conflict *psVar3;
  QtPrivate *pQVar4;
  Data *pDVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  iterator iVar12;
  QArrayData *pQVar13;
  qsizetype qVar14;
  pointer pQVar15;
  qsizetype qVar16;
  int __oflag;
  QString *e;
  QString *name_00;
  long lVar17;
  QString *str;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringList *ret;
  QRegularExpressionMatchIterator m;
  QRegularExpression macro;
  QRegularExpressionMatch match_1;
  QRegularExpressionMatchIterator m_1;
  QRegularExpressionMatch match;
  QTextStream stream;
  qsizetype local_168;
  QString local_128;
  QArrayDataPointer<QString> local_108;
  QRegularExpressionMatch local_e8;
  QRegularExpression local_e0;
  undefined1 local_d8 [24];
  QString *pQStack_c0;
  char16_t *local_b8;
  QIODevice local_a8;
  QArrayDataPointer<QString> local_98;
  QArrayData *local_78;
  QtPrivate *pQStack_70;
  storage_type_conflict *local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)0x0;
  pQStack_70 = (QtPrivate *)0x1301c2;
  local_68 = (storage_type_conflict *)0x2;
  QString::split((QStringList *)&local_98,name,(QString *)&local_78,(SplitBehavior)0x0,CaseSensitive
                );
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  iVar12 = QList<QString>::end((QList<QString> *)&local_98);
  data = &(iVar12.i[-1].d.d)->super_QArrayData;
  pcVar2 = iVar12.i[-1].d.ptr;
  psVar3 = (storage_type_conflict *)iVar12.i[-1].d.size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar17 = (includes->d).size;
  if (lVar17 != 0) {
    name_00 = (includes->d).ptr;
    pQVar1 = name_00 + lVar17;
    bVar9 = false;
    do {
      local_a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d_ptr._M_t.
      super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
      super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
      super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
           (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
           &DAT_aaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)&local_a8,name_00);
      iVar10 = QFile::open((QFile *)&local_a8,(char *)0x11,__oflag);
      if ((char)iVar10 == '\0') {
        QFile::~QFile((QFile *)&local_a8);
        break;
      }
      local_d8._16_8_ = (QArrayData *)0x0;
      pQStack_c0 = (QString *)0x0;
      local_b8 = (char16_t *)0x0;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = (QTextStream *)(local_d8 + 8);
      QTextStream::QTextStream(this_00,&local_a8);
      while (bVar6 = QTextStream::atEnd(this_00), !bVar6) {
        local_68 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_70 = (QtPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QTextStream::readLine(&local_58,this_00,0);
        QString::trimmed_helper((QString *)&local_78,&local_58);
        pDVar5 = local_58.d.d;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_58.d.ptr = (char16_t *)CONCAT71(local_58.d.ptr._1_7_,10);
        local_58.d.d = (Data *)&local_78;
        operator+=((QString *)(local_d8 + 0x10),(QStringBuilder<QString_&,_QLatin1Char> *)&local_58)
        ;
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
      }
      local_78 = (QArrayData *)0x0;
      pQStack_70 = (QtPrivate *)0x1304a2;
      local_68 = (storage_type_conflict *)0x2;
      pQVar13 = (QArrayData *)
                QString::indexOf((QString *)(local_d8 + 0x10),(QString *)&local_78,0,CaseSensitive);
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
      while (-1 < (long)pQVar13) {
        local_78 = (QArrayData *)pQStack_c0;
        pQStack_70 = (QtPrivate *)local_b8;
        QStringView::indexOf((QStringView *)&local_78,(QChar)0xa,(qsizetype)pQVar13,CaseSensitive);
        QString::remove((QString *)(local_d8 + 0x10),(char *)pQVar13);
        local_78 = (QArrayData *)0x0;
        pQStack_70 = (QtPrivate *)0x1304a2;
        local_68 = (storage_type_conflict *)0x2;
        local_58.d.d = (Data *)QString::indexOf((QString *)(local_d8 + 0x10),(QString *)&local_78,
                                                (qsizetype)pQVar13,CaseSensitive);
        pQVar13 = (QArrayData *)local_58.d.d;
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
            pQVar13 = &(local_58.d.d)->super_QArrayData;
          }
        }
      }
      local_78 = (QArrayData *)0x0;
      pQStack_70 = (QtPrivate *)0x1304a8;
      local_68 = (storage_type_conflict *)0x2;
      local_58.d.d = (Data *)QString::indexOf((QString *)(local_d8 + 0x10),(QString *)&local_78,0,
                                              CaseSensitive);
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
      while (-1 < (long)local_58.d.d) {
        local_78 = (QArrayData *)0x0;
        pQStack_70 = (QtPrivate *)0x1304ae;
        local_68 = (storage_type_conflict *)0x2;
        qVar14 = QString::indexOf((QString *)(local_d8 + 0x10),(QString *)&local_78,
                                  (qsizetype)local_58.d.d,CaseSensitive);
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
        pDVar5 = local_58.d.d;
        if (qVar14 == -1) break;
        QString::remove((QString *)(local_d8 + 0x10),(char *)local_58.d.d);
        local_78 = (QArrayData *)0x0;
        pQStack_70 = (QtPrivate *)0x1304a8;
        local_68 = (storage_type_conflict *)0x2;
        local_58.d.d = (Data *)QString::indexOf((QString *)(local_d8 + 0x10),(QString *)&local_78,
                                                (qsizetype)pDVar5,CaseSensitive);
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
      }
      local_58.d.d = (Data *)0x0;
      local_78 = (QArrayData *)0x0;
      while (bVar6 = findSpaceRange((QString *)(local_d8 + 0x10),(qsizetype *)&local_58,
                                    (qsizetype *)&local_78), bVar6) {
        QString::remove((QString *)(local_d8 + 0x10),(char *)local_58.d.d);
      }
      if ((ulong)local_98.size < (undefined1 *)0x2) {
        local_168 = 0;
      }
      else {
        lVar17 = 0;
        local_168 = 0;
        do {
          local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78 = (QArrayData *)0x0;
          pQStack_70 = (QtPrivate *)0x1301c8;
          local_68 = (storage_type_conflict *)0x3c;
          QRegularExpression::QRegularExpression
                    ((QRegularExpression *)&local_108,(QString *)&local_78,(PatternOptions)0x0);
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,0x10);
            }
          }
          local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          bVar6 = false;
          qVar14 = 0;
          QRegularExpression::globalMatch
                    ((QRegularExpression *)&local_128,(QString *)&local_108,
                     (qsizetype)(local_d8 + 0x10),NormalMatch,(MatchOptions)0x0);
          do {
            bVar7 = QRegularExpressionMatchIterator::hasNext
                              ((QRegularExpressionMatchIterator *)&local_128);
            if ((!bVar7) || (bVar6)) break;
            local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)local_d8);
            local_68 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
            local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_70 = (QtPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            QRegularExpressionMatch::captured
                      ((QString *)&local_78,(QRegularExpressionMatch *)local_d8,2);
            bVar7 = QString::endsWith((QString *)&local_78,(QChar)0x3b,CaseSensitive);
            if ((bVar7) ||
               ((pQVar15 = QList<QString>::data((QList<QString> *)&local_98),
                local_68 != (storage_type_conflict *)pQVar15[lVar17].d.size ||
                (lhs.m_size = (qsizetype)pQVar15[lVar17].d.ptr, lhs.m_data = local_68,
                rhs.m_size = qVar14, rhs.m_data = local_68,
                bVar7 = QtPrivate::equalStrings(pQStack_70,lhs,rhs), !bVar7)))) {
LAB_00108fb7:
              bVar8 = QRegularExpressionMatch::hasCaptured((QRegularExpressionMatch *)local_d8,3);
              bVar7 = true;
              if (bVar8) {
                QRegularExpressionMatch::captured(&local_58,(QRegularExpressionMatch *)local_d8,3);
                qVar16 = local_58.d.size;
                pDVar5 = local_58.d.d;
                pQVar4 = pQStack_70;
                pQVar13 = local_78;
                local_58.d.d = (Data *)local_78;
                local_78 = &pDVar5->super_QArrayData;
                pQStack_70 = (QtPrivate *)local_58.d.ptr;
                local_58.d.ptr = (char16_t *)pQVar4;
                local_58.d.size = (qsizetype)local_68;
                local_68 = (storage_type_conflict *)qVar16;
                if (pQVar13 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar13,2,0x10);
                  }
                }
                bVar8 = QString::endsWith((QString *)&local_78,(QChar)0x3b,CaseSensitive);
                if (((!bVar8) &&
                    (pQVar15 = QList<QString>::data((QList<QString> *)&local_98),
                    local_68 == (storage_type_conflict *)pQVar15[lVar17].d.size)) &&
                   (lhs_00.m_size = (qsizetype)pQVar15[lVar17].d.ptr, lhs_00.m_data = local_68,
                   rhs_00.m_size = qVar14, rhs_00.m_data = local_68,
                   bVar8 = QtPrivate::equalStrings(pQStack_70,lhs_00,rhs_00), bVar8)) {
                  iVar10 = 3;
                  qVar16 = QRegularExpressionMatch::capturedStart
                                     ((QRegularExpressionMatch *)local_d8,3);
                  if ((int)local_168 < qVar16) goto LAB_001090af;
                }
              }
            }
            else {
              iVar10 = 2;
              qVar16 = QRegularExpressionMatch::capturedStart((QRegularExpressionMatch *)local_d8,2)
              ;
              if (qVar16 <= (int)local_168) goto LAB_00108fb7;
LAB_001090af:
              local_168 = QRegularExpressionMatch::capturedStart
                                    ((QRegularExpressionMatch *)local_d8,iVar10);
              bVar6 = true;
              bVar7 = false;
            }
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,0x10);
              }
            }
            QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)local_d8);
          } while (bVar7);
          QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                    ((QRegularExpressionMatchIterator *)&local_128);
          QRegularExpression::~QRegularExpression((QRegularExpression *)&local_108);
          if (!bVar6) {
            bVar6 = true;
            goto LAB_001094c6;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (long)(local_98.size + -1));
        local_168 = (qsizetype)(int)local_168;
      }
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = (QArrayData *)0x0;
      pQStack_70 = (QtPrivate *)0x130242;
      local_68 = (storage_type_conflict *)0x15;
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)local_d8,(QString *)&local_78,(PatternOptions)0x0);
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,0x10);
        }
      }
      local_e0.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      qVar14 = 0;
      QRegularExpression::globalMatch
                (&local_e0,(QString *)local_d8,(qsizetype)(local_d8 + 0x10),NormalMatch,
                 (MatchOptions)0x0);
      bVar7 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_e0)
      ;
      bVar6 = true;
      if (bVar7) {
        do {
          local_e8.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_e8);
          qVar16 = QRegularExpressionMatch::capturedStart(&local_e8,0);
          if (qVar16 < local_168) {
            QRegularExpressionMatch::~QRegularExpressionMatch(&local_e8);
          }
          else {
            local_68 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
            local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
            pQStack_70 = (QtPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            QRegularExpressionMatch::captured((QString *)&local_78,&local_e8,1);
            bVar6 = false;
            bVar7 = true;
            if ((local_68 == psVar3) &&
               (lhs_01.m_size = (qsizetype)pcVar2, lhs_01.m_data = psVar3, rhs_01.m_size = qVar14,
               rhs_01.m_data = psVar3, bVar8 = QtPrivate::equalStrings(pQStack_70,lhs_01,rhs_01),
               bVar8)) {
              qVar14 = QRegularExpressionMatch::capturedEnd(&local_e8,0);
              local_58.d.d = (Data *)pQStack_c0;
              local_58.d.ptr = local_b8;
              qVar14 = QStringView::indexOf
                                 ((QStringView *)&local_58,(QChar)0x7b,qVar14,CaseSensitive);
              uVar11 = (uint)qVar14;
              local_58.d.d = (Data *)pQStack_c0;
              local_58.d.ptr = local_b8;
              qVar14 = QStringView::indexOf
                                 ((QStringView *)&local_58,(QChar)0x7d,(long)(int)uVar11,
                                  CaseSensitive);
              local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QString::mid(&local_58,(QString *)(local_d8 + 0x10),(long)(int)(uVar11 + 1),
                           (long)(int)((int)qVar14 + ~uVar11));
              local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_108.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
              qVar14 = 1;
              QString::split((QStringList *)&local_108,&local_58,(QChar)0xa,(SplitBehavior)0x0,
                             CaseSensitive);
              if ((undefined1 *)local_108.size != (undefined1 *)0x0) {
                lVar17 = local_108.size * 0x18;
                str = local_108.ptr;
                do {
                  local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  QString::trimmed_helper(&local_128,str);
                  if (((undefined1 *)local_128.d.size != (undefined1 *)0x0) &&
                     (bVar9 = QString::startsWith(&local_128,(QChar)0x23,CaseSensitive), !bVar9)) {
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                              ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                               (__return_storage_ptr__->d).size,&local_128);
                    QList<QString>::end(__return_storage_ptr__);
                  }
                  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  str = str + 1;
                  lVar17 = lVar17 + -0x18;
                } while (lVar17 != 0);
              }
              QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              bVar9 = true;
              bVar6 = true;
              bVar7 = false;
            }
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,0x10);
              }
            }
            QRegularExpressionMatch::~QRegularExpressionMatch(&local_e8);
            if (!bVar7) goto LAB_001094a5;
          }
          bVar6 = QRegularExpressionMatchIterator::hasNext
                            ((QRegularExpressionMatchIterator *)&local_e0);
        } while (bVar6);
        bVar6 = false;
LAB_001094a5:
        bVar6 = !bVar6;
      }
      QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                ((QRegularExpressionMatchIterator *)&local_e0);
      QRegularExpression::~QRegularExpression((QRegularExpression *)local_d8);
LAB_001094c6:
      QTextStream::~QTextStream((QTextStream *)(local_d8 + 8));
      if ((QArrayData *)local_d8._16_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._16_8_,2,0x10);
        }
      }
      QFile::~QFile((QFile *)&local_a8);
      if (!bVar6) {
        if (!bVar9) {
          QArrayDataPointer<QString>::~QArrayDataPointer(&__return_storage_ptr__->d);
        }
        break;
      }
      name_00 = name_00 + 1;
    } while (name_00 != pQVar1);
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList Parser::findEnumValues(const QString &name, const QStringList &includes)
{
    QStringList split = name.split(QStringLiteral("::"));
    QString enumName = split.last();
    DEBUGPRINTF(printf("searching for %s\n", qPrintable(name)));
    QStringList ret;
    for (const QString &filename : includes) {
        QFile input(filename);
        if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
            DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                                qPrintable(filename), qPrintable(input.errorString())));
            return ret;
        }
        QString data;
        QTextStream stream(&input);
        while (!stream.atEnd()) {
            QString line = stream.readLine().trimmed();
            data += line + QLatin1Char('\n');
        }
        simplifyData(data);

        int pos = 0;
        bool valid = true;
        for (int i = 0; i < split.size() - 1; i++) {
            QRegularExpression macro(QStringLiteral("(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            bool found = false;
            while (m.hasNext() && !found) {
                QRegularExpressionMatch match = m.next();
                QString n = match.captured(2);
                if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(2) > pos) {
                    pos = match.capturedStart(2);
                    found = true;
                    break;
                }
                if (match.hasCaptured(3)) {
                    n = match.captured(3);
                    if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(3) > pos) {
                        pos = match.capturedStart(3);
                        found = true;
                        break;
                    }
                }
            }
            if (!found) {
                valid = false;
                break;
            }
        }

        if (valid) {
            QRegularExpression macro(QStringLiteral("enum +([A-Za-z0-9_]*)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            while (m.hasNext()) {
                QRegularExpressionMatch match = m.next();

                if (match.capturedStart() < pos)
                    continue;

                QString n = match.captured(1);

                if (n == enumName) {
                    DEBUGPRINTF(printf("Found enum: %s\n", qPrintable(n)));
                    int begin = data.indexOf(QLatin1Char('{'), match.capturedEnd());
                    int end = data.indexOf(QLatin1Char('}'), begin);
                    QString block = data.mid(begin + 1, end - begin - 1);
                    const QStringList enums = block.split(QLatin1Char('\n'));
                    for (const auto &e : enums) {
                        const auto trimmed = e.trimmed();
                        if (!trimmed.isEmpty() && !trimmed.startsWith(QLatin1Char('#')))
                            ret << trimmed;
                    }

                    return ret;
                }
            }
        }
    }
    return ret;
}